

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool memequals(void *s1,void *s2,size_t n)

{
  _Bool _Var1;
  int iVar2;
  size_t in_stack_000000e0;
  void *in_stack_000000e8;
  void *in_stack_000000f0;
  size_t n_local;
  void *s2_local;
  void *s1_local;
  
  if (n == 0) {
    s1_local._7_1_ = true;
  }
  else {
    _Var1 = croaring_avx2();
    if (_Var1) {
      s1_local._7_1_ = _avx2_memequals(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
    }
    else {
      iVar2 = memcmp(s1,s2,n);
      s1_local._7_1_ = iVar2 == 0;
    }
  }
  return s1_local._7_1_;
}

Assistant:

bool memequals(const void *s1, const void *s2, size_t n) {
    if (n == 0) {
        return true;
    }
#ifdef CROARING_IS_X64
    if( croaring_avx2() ) {
      return _avx2_memequals(s1, s2, n);
    } else {
      return memcmp(s1, s2, n) == 0;
    }
#else
    return memcmp(s1, s2, n) == 0;
#endif
}